

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void use_item_common(tgestate_t *state,item_t item)

{
  byte in_SIL;
  tgestate_t *in_RDI;
  
  if (in_SIL != 0xff) {
    *(undefined4 *)&in_RDI->saved_mappos = *(undefined4 *)&in_RDI->vischars[0].mi.mappos;
    (in_RDI->saved_mappos).pos16.w = in_RDI->vischars[0].mi.mappos.w;
    if (use_item_common::item_actions_jump_table[in_SIL] != (item_action_t)0x0) {
      (*use_item_common::item_actions_jump_table[in_SIL])(in_RDI);
    }
  }
  return;
}

Assistant:

void use_item_common(tgestate_t *state, item_t item)
{
  /**
   * $7B16: Item actions jump table.
   */
  static const item_action_t item_actions_jump_table[item__LIMIT] =
  {
    action_wiresnips,
    action_shovel,
    action_lockpick,
    action_papers,
    NULL,
    action_bribe,
    action_uniform,
    NULL,
    action_poison,
    action_red_key,
    action_yellow_key,
    action_green_key,
    action_red_cross_parcel,
    NULL,
    NULL,
    NULL,
  };

  assert(state != NULL);

  if (item == item_NONE)
    return;

  ASSERT_ITEM_VALID(item);

  memcpy(&state->saved_mappos,
         &state->vischars[0].mi.mappos,
          sizeof(mappos16_t));

  /* Conv: In the original game the action jumps to a RET for action-less
   * items. We use a NULL instead. */
  if (item_actions_jump_table[item])
    item_actions_jump_table[item](state);
}